

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_compareTo(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  ushort uVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  ushort *puVar5;
  vm_obj_id_t vVar6;
  ulong uVar7;
  size_t len;
  utf8_ptr b;
  utf8_ptr a;
  size_t olen;
  
  if ((getp_compareTo(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_compareTo(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar2 != 0)) {
    getp_compareTo::desc.min_argc_ = 1;
    getp_compareTo::desc.opt_argc_ = 0;
    getp_compareTo::desc.varargs_ = 0;
    __cxa_guard_release(&getp_compareTo(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_compareTo::desc);
  if (iVar2 == 0) {
    uVar1 = *(ushort *)str;
    len = (ulong)uVar1;
    puVar5 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    if (puVar5 == (ushort *)0x0) {
      err_throw(0x7e3);
    }
    a.p_ = str + 2;
    olen = (size_t)*puVar5;
    b.p_ = (char *)(puVar5 + 1);
    retval->typ = VM_NIL;
    uVar7 = (ulong)uVar1;
    while ((uVar7 != 0 && (olen != 0))) {
      wVar3 = utf8_ptr::s_getch(a.p_);
      wVar4 = utf8_ptr::s_getch(b.p_);
      vVar6 = wVar3 - wVar4;
      if (vVar6 != 0) goto LAB_00273ec6;
      utf8_ptr::inc(&a,&len);
      utf8_ptr::inc(&b,&olen);
      uVar7 = len;
    }
    if (retval->typ == VM_NIL) {
      vVar6 = (int)uVar7 - (int)olen;
LAB_00273ec6:
      retval->typ = VM_INT;
      (retval->val).obj = vVar6;
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_compareTo(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* get the other string (leave it on the stack for gc protection) */
    const char *other = G_stk->get(0)->get_as_string(vmg0_);
    if (other == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get its buffer and length */
    size_t olen = vmb_get_len(other);
    other += VMB_LEN;

    /* no result yet */
    retval->set_nil();

    /* compare character by character */
    utf8_ptr a((char *)str);
    utf8_ptr b((char *)other);
    for ( ; len != 0 && olen != 0 ; a.inc(&len), b.inc(&olen))
    {
        int delta = (int)a.getch() - (int)b.getch();
        if (delta != 0)
        {
            retval->set_int(delta);
            break;
        }
    }

    /* if we didn't find any differences, the shorter string sorts first */
    if (retval->typ == VM_NIL)
        retval->set_int(len - olen);

    /* discard arguments */
    G_stk->discard(1);

    /* done */
    return TRUE;
}